

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_paths.cpp
# Opt level: O0

parser<pstore::exchange::import_ns::callbacks> *
anon_unknown.dwarf_2b80ee::import_strings_parser
          (parser<pstore::exchange::import_ns::callbacks> *__return_storage_ptr__,
          transaction *transaction,string_mapping *names)

{
  database *this;
  string_mapping *in_R8;
  string_mapping *names_local;
  transaction *transaction_local;
  
  this = pstore::transaction_base::db(&transaction->super_transaction_base);
  (anonymous_namespace)::
  make_json_array_parser<pstore::exchange::import_ns::strings_array_members,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*>
            (__return_storage_ptr__,(_anonymous_namespace_ *)this,(database *)transaction,
             (transaction<std::unique_lock<mock_mutex>_> *)names,in_R8);
  return __return_storage_ptr__;
}

Assistant:

decltype (auto)
    import_strings_parser (transaction * const transaction,
                           pstore::exchange::import_ns::string_mapping * const names) {
        return make_json_array_parser<pstore::exchange::import_ns::strings_array_members> (
            &transaction->db (), transaction, names);
    }